

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Multiband.cpp
# Opt level: O0

float __thiscall Multiband::CompressorChannel::Process(CompressorChannel *this,float input)

{
  float fVar1;
  float local_34;
  float t;
  float sideChainLevel;
  float timeConst;
  float s;
  float g;
  float input_local;
  CompressorChannel *this_local;
  
  timeConst = 1.0;
  fVar1 = FastClip(input * input,1e-11,100.0);
  if (fVar1 < this->env || fVar1 == this->env) {
    local_34 = this->rel;
  }
  else {
    local_34 = this->atk;
  }
  this->env = (fVar1 - this->env) * local_34 + 1e-16 + this->env;
  fVar1 = log10f(this->env);
  fVar1 = fVar1 * 10.0 - this->thr;
  if (this->knee <= ABS(fVar1)) {
    if (0.0 < fVar1) {
      timeConst = powf(this->exp2,fVar1);
    }
  }
  else {
    fVar1 = this->knee + fVar1;
    timeConst = powf(this->exp1,fVar1 * fVar1);
  }
  this->reduction = timeConst;
  return input * timeConst;
}

Assistant:

inline float Process(float input)
        {
            float g = 1.0f;
            float s = FastClip(input * input, 1.0e-11f, 100.0f);
            float timeConst = (s > env) ? atk : rel;
            env += (s - env) * timeConst + 1.0e-16f; // add small constant to always positive number to avoid denormal numbers
            float sideChainLevel = 10.0f * log10f(env); // multiply by 10 (not 20) because duckEnvelope is RMS
            float t = sideChainLevel - thr;
            if (fabsf(t) < knee)
            {
                t += knee;
                g = powf(exp1, t * t);
            }
            else if (t > 0.0f)
                g = powf(exp2, t);
            reduction = g;
            return input * g;
        }